

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

bool __thiscall flatbuffers::Parser::Parse(Parser *this,char *source)

{
  pointer pFVar1;
  pointer puVar2;
  pointer pcVar3;
  EnumDef *pEVar4;
  bool bVar5;
  Offset<flatbuffers::Table> root;
  pointer ppSVar6;
  pointer ppEVar7;
  StructDef *extraout_RDX;
  StructDef *pSVar8;
  pointer ppEVar9;
  string root_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [3];
  
  this->cursor_ = source;
  this->source_ = source;
  this->line_ = 1;
  (this->error_)._M_string_length = 0;
  *(this->error_)._M_dataplus._M_p = '\0';
  pFVar1 = (this->builder_).offsetbuf_.
           super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->builder_).buf_.cur_ = (this->builder_).buf_.buf_ + (this->builder_).buf_.reserved_;
  if ((this->builder_).offsetbuf_.
      super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar1) {
    (this->builder_).offsetbuf_.
    super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar1;
  }
  puVar2 = (this->builder_).vtables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->builder_).vtables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->builder_).vtables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  Next(this);
LAB_0010edf5:
  switch(this->token_) {
  case 0:
    goto switchD_0010ee09_caseD_0;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_0010ee09_caseD_1:
    ParseDecl(this);
    goto LAB_0010edf5;
  case 7:
    bVar5 = false;
    break;
  case 8:
    bVar5 = true;
    break;
  case 9:
    Next(this);
    while( true ) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->name_space_,&this->attribute_);
      Expect(this,4);
      if (this->token_ != 0x2e) break;
      Next(this);
    }
    Expect(this,0x3b);
    goto LAB_0010edf5;
  case 10:
    Next(this);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    pcVar3 = (this->attribute_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar3,pcVar3 + (this->attribute_)._M_string_length);
    Expect(this,4);
    Expect(this,0x3b);
    bVar5 = SetRootType(this,local_b0._M_dataplus._M_p);
    if (!bVar5) goto LAB_0010f022;
    if (this->root_struct_def->fixed == true) goto LAB_0010eff6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    goto LAB_0010edf5;
  default:
    if (this->token_ != 0x7b) goto switchD_0010ee09_caseD_1;
    if (this->root_struct_def != (StructDef *)0x0) {
      if (((int)(this->builder_).buf_.reserved_ - *(int *)&(this->builder_).buf_.cur_) +
          *(int *)&(this->builder_).buf_.buf_ == 0) goto LAB_0010ee3f;
      goto LAB_0010f06c;
    }
    goto LAB_0010f042;
  }
  ParseEnum(this,bVar5);
  goto LAB_0010edf5;
LAB_0010ee3f:
  root.o = ParseTable(this,this->root_struct_def);
  FlatBufferBuilder::Finish<flatbuffers::Table>(&this->builder_,root);
  goto LAB_0010edf5;
LAB_0010eff6:
  local_90[0]._M_dataplus._M_p = (pointer)&local_90[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"root type must be a table","")
  ;
  Error(local_90);
LAB_0010f022:
  std::operator+(local_90,"unknown root type: ",&local_b0);
  Error(local_90);
LAB_0010f042:
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"no root type set to parse json with","");
  Error(&local_b0);
LAB_0010f06c:
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"cannot have more than one json object in a file","");
  Error(&local_b0);
  pSVar8 = extraout_RDX;
LAB_0010f096:
  std::operator+(&local_b0,"type referenced but not defined: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar8);
  Error(&local_b0);
  goto LAB_0010f0b1;
switchD_0010ee09_caseD_0:
  for (ppSVar6 = (this->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar6 !=
      (this->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppSVar6 = ppSVar6 + 1) {
    pSVar8 = *ppSVar6;
    if (pSVar8->predecl == true) goto LAB_0010f096;
  }
  for (ppEVar7 = (this->enums_).vec.
                 super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar7 !=
      (this->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar7 = ppEVar7 + 1) {
    pEVar4 = *ppEVar7;
    if (pEVar4->is_union == true) {
      for (ppEVar9 = (pEVar4->vals).vec.
                     super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppEVar9 !=
          (pEVar4->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppEVar9 = ppEVar9 + 1) {
        pSVar8 = (*ppEVar9)->struct_def;
        if ((pSVar8 != (StructDef *)0x0) && (pSVar8->fixed == true)) {
          std::operator+(&local_b0,"only tables can be union elements: ",&(*ppEVar9)->name);
          Error(&local_b0);
          goto LAB_0010eff6;
        }
      }
    }
  }
  if ((this->struct_stack_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->struct_stack_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    return true;
  }
LAB_0010f0b1:
  __assert_fail("!struct_stack_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_parser.cpp"
                ,0x2d0,"bool flatbuffers::Parser::Parse(const char *)");
}

Assistant:

bool Parser::Parse(const char *source) {
  source_ = cursor_ = source;
  line_ = 1;
  error_.clear();
  builder_.Clear();
  try {
    Next();
    while (token_ != kTokenEof) {
      if (token_ == kTokenNameSpace) {
        Next();
        for (;;) {
          name_space_.push_back(attribute_);
          Expect(kTokenIdentifier);
          if (!IsNext('.')) break;
        }
        Expect(';');
      } else if (token_ == '{') {
        if (!root_struct_def) Error("no root type set to parse json with");
        if (builder_.GetSize()) {
          Error("cannot have more than one json object in a file");
        }
        builder_.Finish(Offset<Table>(ParseTable(*root_struct_def)));
      } else if (token_ == kTokenEnum) {
        ParseEnum(false);
      } else if (token_ == kTokenUnion) {
        ParseEnum(true);
      } else if (token_ == kTokenRootType) {
        Next();
        auto root_type = attribute_;
        Expect(kTokenIdentifier);
        Expect(';');
        if (!SetRootType(root_type.c_str()))
          Error("unknown root type: " + root_type);
        if (root_struct_def->fixed)
          Error("root type must be a table");
      } else {
        ParseDecl();
      }
    }
    for (auto it = structs_.vec.begin(); it != structs_.vec.end(); ++it) {
      if ((*it)->predecl)
        Error("type referenced but not defined: " + (*it)->name);
    }
    for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
      auto &enum_def = **it;
      if (enum_def.is_union) {
        for (auto it = enum_def.vals.vec.begin();
             it != enum_def.vals.vec.end();
             ++it) {
          auto &val = **it;
          if (val.struct_def && val.struct_def->fixed)
            Error("only tables can be union elements: " + val.name);
        }
      }
    }
  } catch (const std::string &msg) {
    error_ = "line " + NumToString(line_) + ": " + msg;
    return false;
  }
  assert(!struct_stack_.size());
  return true;
}